

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::CoroutineBase::unhandled_exception(CoroutineBase *this)

{
  ExceptionOrValue *pEVar1;
  bool bVar2;
  DisposalResults *pDVar3;
  Exception *pEVar4;
  DisposalResults *disposalResults;
  DisposalResults *_disposalResults3173;
  Exception exception;
  CoroutineBase *this_local;
  
  exception.details.builder.disposer = (ArrayDisposer *)this;
  getCaughtExceptionAsKj();
  pDVar3 = readMaybe<kj::_::CoroutineBase::DisposalResults>(&this->maybeDisposalResults);
  if (pDVar3 == (DisposalResults *)0x0) {
    bVar2 = isWaiting(this);
    if (bVar2) {
      pEVar1 = this->resultRef;
      pEVar4 = mv<kj::Exception>((Exception *)&_disposalResults3173);
      ExceptionOrValue::addException(pEVar1,pEVar4);
      scheduleResumption(this);
    }
    else {
      bVar2 = std::__n4861::coroutine_handle<void>::done(&this->coroutine);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        inlineRequireFailure
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0xc7e,"!coroutine.done()","",(char *)0x0);
      }
      pEVar1 = this->resultRef;
      pEVar4 = mv<kj::Exception>((Exception *)&_disposalResults3173);
      ExceptionOrValue::addException(pEVar1,pEVar4);
    }
  }
  else {
    bVar2 = Maybe<kj::Exception>::operator==(&pDVar3->exception);
    if (bVar2) {
      pEVar4 = mv<kj::Exception>((Exception *)&_disposalResults3173);
      Maybe<kj::Exception>::operator=(&pDVar3->exception,pEVar4);
    }
  }
  Exception::~Exception((Exception *)&_disposalResults3173);
  return;
}

Assistant:

void CoroutineBase::unhandled_exception() {
  // Pretty self-explanatory, we propagate the exception to the promise which owns us, unless
  // we're being destroyed, in which case we propagate it back to our disposer. Note that all
  // unhandled exceptions end up here, not just ones after the first co_await.

  auto exception = getCaughtExceptionAsKj();

  KJ_IF_SOME(disposalResults, maybeDisposalResults) {
    // Exception during coroutine destruction. Only record the first one.
    if (disposalResults.exception == kj::none) {
      disposalResults.exception = kj::mv(exception);
    }
  } else if (isWaiting()) {
    // Exception during coroutine execution.
    resultRef.addException(kj::mv(exception));
    scheduleResumption();
  } else {
    // Okay, what could this mean? We've already been fulfilled or rejected, but we aren't being
    // destroyed yet. The only possibility is that we are unwinding the coroutine frame due to a
    // successful completion, and something in the frame threw. We can't already be rejected,
    // because rejecting a coroutine involves throwing, which would have unwound the frame prior
    // to setting `waiting = false`.
    //
    // Since we know we're unwinding due to a successful completion, we also know that whatever
    // Event we may have armed has not yet fired, because we haven't had a chance to return to
    // the event loop.

    // final_suspend() has not been called.
#if _MSC_VER && !defined(__clang__)
    // See comment at `finalSuspendCalled`'s definition.
    KJ_IASSERT(!finalSuspendCalled);
#else
    KJ_IASSERT(!coroutine.done());
#endif

    // Since final_suspend() hasn't been called, whatever Event is waiting on us has not fired,
    // and will see this exception.
    resultRef.addException(kj::mv(exception));
  }